

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestExpectation.cpp
# Opt level: O0

void __thiscall psy::C::Ty::Ty(Ty *this,Decl *Decl)

{
  Decl *Decl_local;
  Ty *this_local;
  
  this->decl_ = Decl;
  std::__cxx11::string::string((string *)&this->ident_);
  this->CVR_ = None;
  std::vector<TypeKind,_std::allocator<TypeKind>_>::vector(&this->derivTyKs_);
  std::vector<psy::C::CVR,_std::allocator<psy::C::CVR>_>::vector(&this->derivTyCVRs_);
  std::vector<psy::C::Decay,_std::allocator<psy::C::Decay>_>::vector(&this->derivPtrTyDecay_);
  std::shared_ptr<psy::C::Ty>::shared_ptr(&this->nestedRetTy_,(nullptr_t)0x0);
  std::vector<psy::C::Ty,_std::allocator<psy::C::Ty>_>::vector(&this->parmsTys_);
  return;
}

Assistant:

Ty::Ty(Decl& Decl)
    : decl_(Decl)
    , CVR_(CVR::None)
    , nestedRetTy_(nullptr)
{}